

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::NextAfterFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_391;
  ScalarFunctionSet *local_390;
  code *local_388;
  undefined8 uStack_380;
  code *local_378;
  code *pcStack_370;
  code *local_368;
  undefined8 uStack_360;
  code *local_358;
  code *pcStack_350;
  LogicalType local_340 [24];
  LogicalType local_328 [24];
  LogicalType local_310 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2f8;
  LogicalType local_2e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2c8;
  LogicalType local_2b0 [24];
  LogicalType local_298 [24];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_390 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_340,DOUBLE);
  duckdb::LogicalType::LogicalType(local_328,DOUBLE);
  __l._M_len = 2;
  __l._M_array = local_340;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2c8,__l,&local_391);
  duckdb::LogicalType::LogicalType(local_2e0,DOUBLE);
  uStack_360 = 0;
  local_368 = ScalarFunction::BinaryFunction<double,double,double,duckdb::NextAfterOperator>;
  pcStack_350 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_358 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_298,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_2c8,local_2e0,&local_368,0,0,0,0,local_298,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_390 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_298);
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,3);
  }
  duckdb::LogicalType::~LogicalType(local_2e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2c8);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_340 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_340,FLOAT);
  duckdb::LogicalType::LogicalType(local_328,FLOAT);
  __l_00._M_len = 2;
  __l_00._M_array = local_340;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2f8,__l_00,&local_391);
  duckdb::LogicalType::LogicalType(local_310,FLOAT);
  uStack_380 = 0;
  local_388 = ScalarFunction::BinaryFunction<float,float,float,duckdb::NextAfterOperator>;
  pcStack_370 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_2f8,local_310,&local_388,0,0,0,0,local_2b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_280 + 0xb0U),(_Any_data *)((long)&local_280 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_2b0);
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,3);
  }
  duckdb::LogicalType::~LogicalType(local_310);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2f8);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_340 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return local_390;
}

Assistant:

ScalarFunctionSet NextAfterFun::GetFunctions() {
	ScalarFunctionSet next_after_fun;
	next_after_fun.AddFunction(
	    ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                   ScalarFunction::BinaryFunction<double, double, double, NextAfterOperator>));
	next_after_fun.AddFunction(ScalarFunction({LogicalType::FLOAT, LogicalType::FLOAT}, LogicalType::FLOAT,
	                                          ScalarFunction::BinaryFunction<float, float, float, NextAfterOperator>));
	return next_after_fun;
}